

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool Json::containsControlCharacter0(char *str,uint len)

{
  bool bVar1;
  char *end;
  char *pcStack_18;
  uint len_local;
  char *str_local;
  
  pcStack_18 = str;
  while( true ) {
    if (str + len == pcStack_18) {
      return false;
    }
    bVar1 = isControlCharacter(*pcStack_18);
    if ((bVar1) || (*pcStack_18 == '\0')) break;
    pcStack_18 = pcStack_18 + 1;
  }
  return true;
}

Assistant:

static bool containsControlCharacter0(const char* str, unsigned len) {
  char const* end = str + len;
  while (end != str) {
    if (isControlCharacter(*str) || 0==*str)
      return true;
    ++str;
  }
  return false;
}